

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

void duckdb::ColumnDataCopyArray
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  sel_t *psVar1;
  unsigned_long *puVar2;
  byte bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Vector *this_01;
  idx_t iVar4;
  reference pvVar5;
  VectorDataIndex index;
  VectorChildIndex VVar6;
  reference pvVar7;
  reference pvVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  idx_t i;
  idx_t iVar11;
  idx_t iVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c0;
  Vector *local_b8;
  idx_t local_b0;
  UnifiedVectorFormat local_a8;
  ColumnDataMetaData local_60;
  
  this = meta_data->segment;
  TemplatedColumnDataCopy<duckdb::StructValueCopy>(meta_data,source_data,source,offset,copy_count);
  this_01 = ArrayVector::GetEntry(source);
  local_b8 = source;
  iVar4 = ArrayType::GetSize(&source->type);
  pvVar5 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  if ((pvVar5->child_index).index == 0xffffffffffffffff) {
    index = ColumnDataCollectionSegment::AllocateVector
                      (this,&this_01->type,meta_data->chunk_data,
                       &meta_data->state->current_chunk_state,(VectorDataIndex)0xffffffffffffffff);
    VVar6 = ColumnDataCollectionSegment::AddChildIndex(meta_data->segment,index);
    pvVar5 = vector<duckdb::VectorMetaData,_true>::operator[]
                       (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
    (pvVar5->child_index).index = VVar6.index;
  }
  pvVar7 = vector<duckdb::ColumnDataCopyFunction,_true>::operator[]
                     (&meta_data->copy_function->child_functions,0);
  pvVar5 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  pvVar8 = vector<duckdb::VectorDataIndex,_true>::operator[]
                     (&this->child_indices,(pvVar5->child_index).index);
  iVar11 = pvVar8->index;
  if (iVar11 != 0xffffffffffffffff) {
    iVar12 = iVar11;
    do {
      pvVar5 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,iVar12);
      iVar12 = (pvVar5->next_data).index;
    } while (iVar12 != 0xffffffffffffffff);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_a8);
  local_60.segment = meta_data->segment;
  local_60.state = meta_data->state;
  local_60.chunk_data = meta_data->chunk_data;
  local_60.child_list_size = 0xffffffffffffffff;
  local_c0 = iVar4 * copy_count;
  local_60.copy_function = pvVar7;
  local_60.vector_data_index.index = iVar11;
  Vector::ToUnifiedFormat(this_01,local_c0,&local_a8);
  if (copy_count != 0 &&
      (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    iVar11 = 0;
    do {
      uVar13 = offset + iVar11;
      psVar1 = source_data->sel->sel_vector;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar13];
      }
      puVar2 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 != (unsigned_long *)0x0) &&
         ((puVar2[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0 && iVar4 != 0)) {
        uVar13 = uVar13 * iVar4;
        _Var10._M_head_impl =
             local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
        iVar12 = iVar4;
        do {
          if (_Var10._M_head_impl == (unsigned_long *)0x0) {
            local_b0 = local_a8.validity.super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_d8,&local_b0);
            this_00._M_pi =
                 local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Stack_d0;
            local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_d8;
            local_d8 = (element_type *)0x0;
            p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
               p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
            }
            pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&local_a8.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_data);
            _Var10._M_head_impl =
                 (pTVar9->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var10._M_head_impl;
          }
          bVar3 = (byte)uVar13 & 0x3f;
          _Var10._M_head_impl[uVar13 >> 6] =
               _Var10._M_head_impl[uVar13 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          uVar13 = uVar13 + 1;
          iVar12 = iVar12 - 1;
        } while (iVar12 != 0);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != copy_count);
  }
  if (local_b8->vector_type == CONSTANT_VECTOR) {
    if (copy_count != 0) {
      do {
        (*pvVar7->function)(&local_60,&local_a8,this_01,0,iVar4);
        copy_count = copy_count - 1;
      } while (copy_count != 0);
    }
  }
  else {
    (*pvVar7->function)(&local_60,&local_a8,this_01,iVar4 * offset,local_c0);
  }
  if (local_a8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ColumnDataCopyArray(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                         idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	// copy the NULL values for the main array vector (the same as for a struct vector)
	TemplatedColumnDataCopy<StructValueCopy>(meta_data, source_data, source, offset, copy_count);

	auto &child_vector = ArrayVector::GetEntry(source);
	auto &child_type = child_vector.GetType();
	auto array_size = ArrayType::GetSize(source.GetType());

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_child_index = child_vdata.next_data;
	}

	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	child_vector.ToUnifiedFormat(copy_count * array_size, child_vector_data);

	// Broadcast and sync the validity of the array vector to the child vector

	if (source_data.validity.IsMaskSet()) {
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = source_data.sel->get_index(offset + i);
			if (!source_data.validity.RowIsValid(source_idx)) {
				for (idx_t j = 0; j < array_size; j++) {
					child_vector_data.validity.SetInvalid(source_idx * array_size + j);
				}
			}
		}
	}

	auto is_constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// If the array is constant, we need to copy the child vector n times
	if (is_constant) {
		for (idx_t i = 0; i < copy_count; i++) {
			child_function.function(child_meta_data, child_vector_data, child_vector, 0, array_size);
		}
	} else {
		child_function.function(child_meta_data, child_vector_data, child_vector, offset * array_size,
		                        copy_count * array_size);
	}
}